

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O2

void __thiscall FastVector<char,_true,_true>::grow(FastVector<char,_true,_true> *this,uint newSize)

{
  char *ptr;
  
  ptr = this->data;
  grow_no_destroy(this,newSize);
  if (ptr != (char *)0x0) {
    NULLC::alignedDealloc(ptr);
    return;
  }
  return;
}

Assistant:

void grow(unsigned newSize)
	{
		T* oldData = data;
		unsigned oldMax = max;

		grow_no_destroy(newSize);

		if(oldData)
		{
			if(!skipConstructor)
				NULLC::destruct(oldData, oldMax);
			else
				NULLC::alignedDealloc(oldData);
		}
	}